

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.cpp
# Opt level: O0

int main(void)

{
  void **ppvVar1;
  ostream *poVar2;
  info i;
  cothread_t fc;
  _func_void *in_stack_00000158;
  uint in_stack_00000164;
  cothread_t local_18;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffff4;
  
  diy::coroutine::co_create(in_stack_00000164,in_stack_00000158);
  local_18 = diy::coroutine::co_active();
  uVar3 = 5;
  ppvVar1 = diy::coroutine::argument();
  *ppvVar1 = &local_18;
  poVar2 = std::operator<<((ostream *)&std::cout,"Jumping to f()");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  diy::coroutine::co_switch((cothread_t)CONCAT44(in_stack_fffffffffffffff4,uVar3));
  poVar2 = std::operator<<((ostream *)&std::cout,"Back in main");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  diy::coroutine::co_switch((cothread_t)CONCAT44(in_stack_fffffffffffffff4,uVar3));
  diy::coroutine::co_delete((cothread_t)0x101368);
  poVar2 = std::operator<<((ostream *)&std::cout,"Done");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
    auto fc = dc::co_create(4*1024*1024, &f);

    info i;
    i.main = dc::co_active();
    i.arg  = 5;

    dc::argument() = &i;

    std::cout << "Jumping to f()" << std::endl;

    dc::co_switch(fc);
    std::cout << "Back in main" << std::endl;

    dc::co_switch(fc);
    dc::co_delete(fc);

    std::cout << "Done" << std::endl;
}